

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureCube(GatherBase *this)

{
  CallLogWrapper *this_00;
  GLenum target;
  bool bVar1;
  uint internalformat;
  GLenum GVar2;
  int level;
  uint width;
  long lVar3;
  allocator_type local_a1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_a0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_98;
  long local_80;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  GVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,this->tex);
  width = 0x20;
  local_a0 = &local_98;
  for (level = 0; level != 6; level = level + 1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_98,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&pixels,(ulong)(width * width),(value_type *)&local_98,&local_a1);
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      glu::CallLogWrapper::glTexImage2D
                (this_00,*(GLenum *)((long)&DAT_017446c0 + lVar3),level,internalformat,width,width,0
                 ,GVar2,0x1406,
                 pixels.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    width = width >> 1;
  }
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f5000003f400000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3f7000003f600000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3f1000003f000000;
  local_58 = 0x3d80000000000000;
  uStack_50 = 0x3e4000003e000000;
  local_48 = 0x3ea000003e800000;
  uStack_40 = 0x3ee000003ec00000;
  local_98.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f400000;
  local_98.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e80000000000000;
  if (GVar2 != 0x1902) {
    local_a0 = &pixels;
  }
  lVar3 = 0;
  while (lVar3 != 0x18) {
    target = *(GLenum *)((long)&DAT_017446c0 + lVar3);
    local_80 = lVar3;
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x16,0x19,2,2,GVar2,0x1406,local_a0);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x10,10,1,1,GVar2,0x1406,&pixels);
    glu::CallLogWrapper::glTexSubImage2D
              (this_00,target,0,0xb,2,1,1,GVar2,0x1406,
               &pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x18,0xd,1,1,GVar2,0x1406,&local_58);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,9,0xe,1,1,GVar2,0x1406,&local_48);
    lVar3 = local_80 + 4;
  }
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2803,0x812f);
  GVar2 = 0x8513;
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x8072,0x812f);
  bVar1 = IsFloatingPointTexture((GatherBase *)(ulong)internalformat,GVar2);
  if (bVar1) {
    glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2700);
  }
  return;
}

Assistant:

virtual GLvoid CreateTextureCube()
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		const GLenum faces[6] = { GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z };

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size, Vec4(1.0));
			for (int j = 0; j < 6; ++j)
			{
				glTexImage2D(faces[j], i, internal_format, size, size, 0, format, GL_FLOAT, &pixels[0]);
			}
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		Vec4  depthData(data[0][0], data[1][0], data[2][0], data[3][0]);
		Vec4* packedData = (format == GL_DEPTH_COMPONENT) ? &depthData : data;

		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 22, 25, 2, 2, format, GL_FLOAT, packedData);
			glTexSubImage2D(faces[j], 0, 16, 10, 1, 1, format, GL_FLOAT, data + 0);
			glTexSubImage2D(faces[j], 0, 11, 2, 1, 1, format, GL_FLOAT, data + 1);
			glTexSubImage2D(faces[j], 0, 24, 13, 1, 1, format, GL_FLOAT, data + 2);
			glTexSubImage2D(faces[j], 0, 9, 14, 1, 1, format, GL_FLOAT, data + 3);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}